

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O2

bool cmSystemTools::RepeatedRemoveDirectory(char *dir)

{
  bool bVar1;
  uint uVar2;
  allocator local_51;
  string local_50;
  
  for (uVar2 = 0; uVar2 != 10; uVar2 = uVar2 + 1) {
    std::__cxx11::string::string((string *)&local_50,dir,&local_51);
    bVar1 = cmsys::SystemTools::RemoveADirectory(&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    if (bVar1) break;
    cmsys::SystemTools::Delay(100);
  }
  return uVar2 < 10;
}

Assistant:

bool cmSystemTools::RepeatedRemoveDirectory(const char* dir)
{
  // Windows sometimes locks files temporarily so try a few times.
  for (int i = 0; i < 10; ++i) {
    if (cmSystemTools::RemoveADirectory(dir)) {
      return true;
    }
    cmSystemTools::Delay(100);
  }
  return false;
}